

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O2

int32_t __thiscall icu_63::RegexMatcher::end(RegexMatcher *this,UErrorCode *err)

{
  int64_t iVar1;
  
  iVar1 = end64(this,0,err);
  return (int32_t)iVar1;
}

Assistant:

int32_t RegexMatcher::end(UErrorCode &err) const {
    return end(0, err);
}